

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

UINT16 TPM2B_ECC_POINT_Marshal(TPM2B_ECC_POINT *source,BYTE **buffer,INT32 *size)

{
  int iVar1;
  BYTE *a;
  UINT16 UVar2;
  UINT16 UVar3;
  
  a = *buffer;
  *buffer = a + 2;
  UVar2 = TPM2B_ECC_PARAMETER_Marshal(&(source->point).x,buffer,size);
  UVar3 = TPM2B_ECC_PARAMETER_Marshal(&(source->point).y,buffer,size);
  if ((size == (INT32 *)0x0) || (iVar1 = *size, *size = iVar1 + -2, 1 < iVar1)) {
    Uint16ToByteArray(UVar3 + UVar2,a);
  }
  return UVar3 + UVar2 + 2;
}

Assistant:

UINT16
TPM2B_ECC_POINT_Marshal(TPM2B_ECC_POINT *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    BYTE      *sizeField = *buffer;
    // Advance buffer pointer by canonical size of a UINT16
    *buffer += 2;
    // Marshal the structure
    result = (UINT16)(result + TPMS_ECC_POINT_Marshal((TPMS_ECC_POINT *)&(source->point), buffer, size));
    // Marshal the size
    result = (UINT16)(result + UINT16_Marshal(&result, &sizeField, size));
    return result;
}